

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O1

int CVmObjString::getp_match(vm_val_t *retval,vm_val_t *self_val,char *str,uint *argc)

{
  vm_val_t *this;
  ushort uVar1;
  uint uVar2;
  re_compiled_pattern *pattern;
  vm_globalvar_t *pvVar3;
  CRegexSearcherSimple *pCVar4;
  bool bVar5;
  anon_union_8_8_cb74652f_for_val aVar6;
  undefined4 uVar7;
  vm_val_t *pvVar8;
  CVmBifTADSGlobals *pCVar9;
  int iVar10;
  int32_t iVar11;
  ushort *puVar12;
  byte *searchstr;
  int iVar13;
  uint uVar14;
  byte *__n;
  byte *pbVar15;
  char *pcVar16;
  byte *searchlen;
  byte *entirestr;
  
  if (argc == (uint *)0x0) {
    uVar14 = 0;
  }
  else {
    uVar14 = *argc;
  }
  if (getp_match(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') {
    getp_match();
  }
  iVar10 = CVmObject::get_prop_check_argc(retval,argc,&getp_match::desc);
  pvVar8 = sp_;
  if (iVar10 != 0) {
    return 1;
  }
  uVar1 = *(ushort *)str;
  searchlen = (byte *)(ulong)uVar1;
  this = sp_ + -1;
  puVar12 = (ushort *)vm_val_t::get_as_string(this);
  if (puVar12 == (ushort *)0x0) {
    if ((this->typ == VM_OBJ) &&
       (uVar2 = pvVar8[-1].val.obj,
       iVar10 = (**(code **)(*(long *)&G_obj_table_X.pages_[uVar2 >> 0xc][uVar2 & 0xfff].ptr_ + 8))
                          (G_obj_table_X.pages_[uVar2 >> 0xc] + (uVar2 & 0xfff),
                           CVmObjPattern::metaclass_reg_), iVar10 != 0)) {
      uVar2 = pvVar8[-1].val.obj;
      pcVar16 = (G_obj_table_X.pages_[uVar2 >> 0xc]->ptr_).obj_ + (uVar2 & 0xfff) * 0x18;
    }
    else {
      pcVar16 = (char *)0x0;
    }
    puVar12 = (ushort *)0x0;
    __n = (byte *)0x0;
    if (pcVar16 == (char *)0x0) {
      err_throw(0x900);
    }
  }
  else {
    __n = (byte *)(ulong)*puVar12;
    puVar12 = puVar12 + 1;
    pcVar16 = (char *)0x0;
  }
  entirestr = (byte *)(str + 2);
  searchstr = entirestr;
  if ((1 < uVar14) && (sp_[-2].typ != VM_NIL)) {
    if (sp_[-2].typ == VM_INT) {
      iVar11 = sp_[-2].val.intval;
    }
    else {
      iVar11 = vm_val_t::nonint_num_to_int(sp_ + -2);
    }
    iVar10 = -1;
    if (iVar11 < 0) {
      if (searchlen == (byte *)0x0) {
        iVar10 = 0;
      }
      else {
        iVar10 = 0;
        pbVar15 = entirestr;
        do {
          pbVar15 = pbVar15 + (ulong)(((*pbVar15 >> 5 & 1) != 0) + 1 & (uint)(*pbVar15 >> 7) * 3) +
                              1;
          iVar10 = iVar10 + 1;
        } while (pbVar15 < entirestr + (long)searchlen);
      }
    }
    bVar5 = 0 < iVar10 + iVar11;
    iVar13 = iVar10 + iVar11;
    if ((iVar13 != 0 && SCARRY4(iVar10,iVar11) == iVar13 < 0) && ((uint)__n < (uint)uVar1)) {
      iVar10 = 1;
      pbVar15 = entirestr;
      do {
        searchstr = pbVar15 + (ulong)(((*pbVar15 >> 5 & 1) != 0) + 1 & (uint)(*pbVar15 >> 7) * 3) +
                              1;
        searchlen = pbVar15 + ((long)searchlen - (long)searchstr);
        bVar5 = iVar10 < iVar13;
        if (iVar13 <= iVar10) break;
        iVar10 = iVar10 + 1;
        pbVar15 = searchstr;
      } while (__n < searchlen);
    }
    iVar10 = 0;
    if (bVar5) {
      retval->typ = VM_NIL;
      iVar10 = 5;
      searchstr = entirestr;
    }
    if (iVar10 == 5) goto LAB_002be5ac;
    if (iVar10 != 0) {
      return 1;
    }
  }
  if (puVar12 == (ushort *)0x0) {
    pattern = (re_compiled_pattern *)**(undefined8 **)(pcVar16 + 8);
    pvVar3 = G_bif_tads_globals_X->last_rex_str;
    uVar7 = *(undefined4 *)&self_val->field_0x4;
    aVar6 = self_val->val;
    (pvVar3->val).typ = self_val->typ;
    *(undefined4 *)&(pvVar3->val).field_0x4 = uVar7;
    (pvVar3->val).val = aVar6;
    pCVar9 = G_bif_tads_globals_X;
    pCVar4 = G_bif_tads_globals_X->rex_searcher;
    *(undefined4 *)&pCVar4->field_0x64 = 0xffffffff;
    *(undefined4 *)&pCVar4->field_0x68 = 0xffffffff;
    *(undefined4 *)&pCVar4->field_0x6c = 0xffffffff;
    *(undefined4 *)&pCVar4->field_0x70 = 0xffffffff;
    *(undefined4 *)&pCVar4->field_0x54 = 0xffffffff;
    *(undefined4 *)&pCVar4->field_0x58 = 0xffffffff;
    *(undefined4 *)&pCVar4->field_0x5c = 0xffffffff;
    *(undefined4 *)&pCVar4->field_0x60 = 0xffffffff;
    *(undefined4 *)&pCVar4->field_0x44 = 0xffffffff;
    *(undefined4 *)&pCVar4->field_0x48 = 0xffffffff;
    *(undefined4 *)&pCVar4->field_0x4c = 0xffffffff;
    *(undefined4 *)&pCVar4->field_0x50 = 0xffffffff;
    *(undefined4 *)&pCVar4->field_0x34 = 0xffffffff;
    *(undefined4 *)&pCVar4->field_0x38 = 0xffffffff;
    *(undefined4 *)&pCVar4->field_0x3c = 0xffffffff;
    *(undefined4 *)&pCVar4->field_0x40 = 0xffffffff;
    *(undefined4 *)&(pCVar4->super_CRegexSearcher).field_0x24 = 0xffffffff;
    *(undefined4 *)&pCVar4->field_0x28 = 0xffffffff;
    *(undefined4 *)&pCVar4->field_0x2c = 0xffffffff;
    *(undefined4 *)&pCVar4->field_0x30 = 0xffffffff;
    (pCVar4->match_).start_ofs = -1;
    (pCVar4->match_).end_ofs = -1;
    iVar10 = CRegexSearcherSimple::match_pattern
                       (pCVar9->rex_searcher,pattern,(char *)entirestr,(char *)searchstr,
                        (size_t)searchlen);
    if (-1 < iVar10) {
      retval->typ = VM_INT;
      (retval->val).intval = iVar10;
      goto LAB_002be5ac;
    }
  }
  else if ((__n <= searchlen) && (iVar10 = bcmp(puVar12,searchstr,(size_t)__n), iVar10 == 0)) {
    retval->typ = VM_INT;
    (retval->val).obj = (uint)__n;
    goto LAB_002be5ac;
  }
  retval->typ = VM_NIL;
LAB_002be5ac:
  sp_ = sp_ + -(long)(int)uVar14;
  return 1;
}

Assistant:

int CVmObjString::getp_match(VMG_ vm_val_t *retval,
                             const vm_val_t *self_val, const char *str,
                             uint *argc)
{
    /* check arguments */
    uint orig_argc = (argc != 0 ? *argc : 0);
    static CVmNativeCodeDesc desc(1, 1);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the string length and buffer pointer */
    size_t len = vmb_get_len(str);
    str += VMB_LEN;

    /* remember the base string */
    const char *basestr = str;
    
    /* retrieve the string or regex pattern to match */
    vm_val_t *targ = G_stk->get(0);
    const char *targstr = 0;
    CVmObjPattern *targpat = 0;
    size_t targstrlen = 0;
    if ((targstr = targ->get_as_string(vmg0_)) != 0)
    {
        /* it's a literal string - get its length and text pointer */
        targstrlen = vmb_get_len(targstr);
        targstr += VMB_LEN;
    }
    else if ((targpat = vm_val_cast(CVmObjPattern, targ)) != 0)
    {
        /* it's a pattern */
    }
    else
    {
        /* we need a string or a pattern; other values are invalid */
        err_throw(VMERR_BAD_TYPE_BIF);
    }

    /* retrieve the starting index, if present */
    int32_t start_idx = 0;
    if (orig_argc >= 2 && G_stk->get(1)->typ != VM_NIL)
    {
        /* get the starting index value */
        start_idx = G_stk->get(1)->num_to_int(vmg0_);

        /* set up a UTF-8 pointer for traversing the string */
        utf8_ptr strp((char *)str);

        /*
         *   A positive index value is a 1-based index from the start of the
         *   string.  A negative index is from the end of the string, with -1
         *   pointing to the last character. 
         */
        start_idx += (start_idx < 0 ? (int)strp.len(len) : -1);

        /* skip that many characters */
        int32_t i;
        for (i = 0 ; i < start_idx && len > targstrlen ; ++i, strp.inc(&len)) ;

        /* 
         *   if the start index was past the end of the string (or past the
         *   point where the remaining subject string is too short for the
         *   target string), we definitely can't match 
         */
        if (i < start_idx)
        {
            retval->set_nil();
            goto done;
        }

        /* start the search here */
        str = strp.getptr();
    }

    /* match the string or pattern */
    if (targstr != 0)
    {
        /* make sure it's long enough, then match the text literally */
        if (len >= targstrlen && memcmp(targstr, str, targstrlen) == 0)
        {
            /* matched - return the match length */
            retval->set_int(targstrlen);
        }
        else
        {
            /* no match */
            retval->set_nil();
        }
    }
    else
    {
        /* RexPattern - get the compiled pattern */
        re_compiled_pattern *cpat = targpat->get_pattern(vmg0_);

        /* save the last search source string */
        G_bif_tads_globals->last_rex_str->val = *self_val;
        G_bif_tads_globals->rex_searcher->clear_group_regs();

        /* match the pattern */
        int matchlen = G_bif_tads_globals->rex_searcher->match_pattern(
            cpat, basestr, str, len);

        /* if it matched (len >= 0), return the length, otherwise nil */
        if (matchlen >= 0)
            retval->set_int(matchlen);
        else
            retval->set_nil();
    }

done:
    /* discard arguments */
    G_stk->discard(orig_argc);

    /* handled */
    return TRUE;
}